

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::
call_matcher_list<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::~call_matcher_list
          (call_matcher_list<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *this)

{
  list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar1;
  list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar2;
  list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *n;
  
  (this->
  super_list<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
  ).
  super_list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ._vptr_list_elem = (_func_int **)&PTR__list_004f8938;
  plVar1 = (this->
           super_list<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
           ).
           super_list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           .next;
  if (plVar1 == (list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                 *)this) {
    (this->
    super_list<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
    ).
    super_list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ._vptr_list_elem = (_func_int **)&PTR__list_elem_004f8958;
    plVar2 = (this->
             super_list<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
             ).
             super_list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
             .prev;
    plVar1->prev = plVar2;
    plVar2->next = plVar1;
    (this->
    super_list<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
    ).
    super_list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .next = (list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
             *)this;
    (this->
    super_list<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
    ).
    super_list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .prev = (list_elem<trompeloeil::call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
             *)this;
    operator_delete(this,0x18);
    return;
  }
  abort();
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto& elem = *i;
      ++i; // intrusive list, so advance before destroying
      Disposer::dispose(&elem);
    }
  }